

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRotationX.hpp
# Opt level: O2

void __thiscall
qclab::qgates::CRotationX<std::complex<float>_>::CRotationX
          (CRotationX<std::complex<float>_> *this,int control,int target,real_type theta,
          int controlState)

{
  uint __line;
  char *__assertion;
  int target_local;
  real_type theta_local;
  
  _target_local = CONCAT44(theta,target);
  QControlledGate2<std::complex<float>_>::QControlledGate2
            (&this->super_QControlledGate2<std::complex<float>_>,control,controlState);
  (this->super_QControlledGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_004d0df0;
  std::make_unique<qclab::qgates::RotationX<std::complex<float>>,int_const&,float_const&>
            ((int *)&this->gate_,(float *)&target_local);
  if (control < 0) {
    __assertion = "control >= 0";
  }
  else {
    if (-1 < target_local) {
      if (target_local != control) {
        return;
      }
      __assertion = "control != target";
      __line = 0x41;
      goto LAB_0032396f;
    }
    __assertion = "target >= 0";
  }
  __line = 0x40;
LAB_0032396f:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CRotationX.hpp"
                ,__line,
                "qclab::qgates::CRotationX<std::complex<float>>::CRotationX(const int, const int, const real_type, const int) [T = std::complex<float>]"
               );
}

Assistant:

CRotationX( const int control , const int target ,
                    const real_type theta , const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< RotationX< T > >( target , theta ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }